

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O1

void __thiscall
QStyle::drawItemPixmap(QStyle *this,QPainter *painter,QRect *rect,int alignment,QPixmap *pixmap)

{
  LayoutDirection direction;
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  double dVar6;
  int iVar8;
  undefined1 auVar7 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 local_88 [16];
  double local_78;
  double local_70;
  double local_68;
  double dStack_60;
  QSize local_58;
  double local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  dVar6 = (double)QPixmap::devicePixelRatio();
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  direction = QGuiApplication::layoutDirection();
  uVar3 = QPixmap::size();
  iVar1 = (int)((ulong)uVar3 >> 0x20);
  auVar7._0_8_ = (double)iVar1;
  auVar7._8_8_ = (double)(int)uVar3;
  auVar10._8_8_ = dVar6;
  auVar10._0_8_ = dVar6;
  auVar7 = divpd(auVar7,auVar10);
  auVar11._0_8_ =
       (double)((ulong)auVar7._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._0_8_;
  auVar11._8_8_ =
       (double)((ulong)auVar7._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._8_8_;
  auVar7 = minpd(_DAT_0066f5d0,auVar11);
  auVar12._8_8_ = -(ulong)(-2147483648.0 < auVar7._8_8_);
  auVar12._0_8_ = -(ulong)(-2147483648.0 < auVar7._0_8_);
  uVar2 = movmskpd(iVar1,auVar12);
  uVar5 = 0x8000000000000000;
  if ((uVar2 & 1) != 0) {
    uVar5 = (ulong)(uint)(int)auVar7._0_8_ << 0x20;
  }
  uVar4 = 0x80000000;
  if ((uVar2 & 2) != 0) {
    uVar4 = (ulong)(uint)(int)auVar7._8_8_;
  }
  local_58 = (QSize)(uVar4 | uVar5);
  local_88 = (undefined1  [16])alignedRect(direction,(Alignment)alignment,&local_58,rect);
  auVar7 = QRect::operator&((QRect *)local_88,rect);
  local_48 = 0xbff0000000000000;
  uStack_40 = 0xbff0000000000000;
  iVar1 = auVar7._0_4_;
  iVar8 = auVar7._4_4_;
  local_58 = (QSize)(double)iVar1;
  dVar9 = (double)((auVar7._8_4_ - iVar1) + 1) * dVar6;
  dVar6 = (double)((auVar7._12_4_ - iVar8) + 1) * dVar6;
  local_50 = (double)iVar8;
  local_78 = (double)(iVar1 - local_88._0_4_);
  local_70 = (double)(iVar8 - local_88._4_4_);
  local_68 = (double)(int)((double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9)
  ;
  dStack_60 = (double)(int)((double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6
                           );
  QPainter::drawPixmap((QRectF *)painter,(QPixmap *)&local_58,(QRectF *)pixmap);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyle::drawItemPixmap(QPainter *painter, const QRect &rect, int alignment,
                            const QPixmap &pixmap) const
{
    qreal scale = pixmap.devicePixelRatio();
    QRect aligned = alignedRect(QGuiApplication::layoutDirection(), QFlag(alignment), pixmap.size() / scale, rect);
    QRect inter = aligned.intersected(rect);

    painter->drawPixmap(inter.x(), inter.y(), pixmap, inter.x() - aligned.x(), inter.y() - aligned.y(), qRound(inter.width() * scale), qRound(inter.height() *scale));
}